

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O1

void ihevc_inter_pred_chroma_vert_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  long lVar1;
  byte *pbVar2;
  short sVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < ht) {
    lVar1 = (long)src_strd;
    uVar5 = 1;
    if (1 < wd * 2) {
      uVar5 = (ulong)(uint)(wd * 2);
    }
    pbVar4 = pu1_src + -lVar1;
    iVar6 = 0;
    do {
      if (0 < wd) {
        uVar8 = 0;
        pbVar2 = pbVar4;
        do {
          lVar9 = 0;
          sVar3 = 0;
          pbVar7 = pbVar2;
          do {
            sVar3 = sVar3 + (ushort)*pbVar7 * (short)pi1_coeff[lVar9];
            lVar9 = lVar9 + 1;
            pbVar7 = pbVar7 + lVar1;
          } while (lVar9 != 4);
          pi2_dst[uVar8] = sVar3;
          uVar8 = uVar8 + 1;
          pbVar2 = pbVar2 + 1;
        } while (uVar8 != uVar5);
      }
      pi2_dst = pi2_dst + dst_strd;
      iVar6 = iVar6 + 1;
      pbVar4 = pbVar4 + lVar1;
    } while (iVar6 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16out(UWORD8 *pu1_src,
                                         WORD16 *pi2_dst,
                                         WORD32 src_strd,
                                         WORD32 dst_strd,
                                         WORD8 *pi1_coeff,
                                         WORD32 ht,
                                         WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 1) * src_strd];
            }

            pi2_dst[col] = i2_tmp;
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }
}